

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O1

void __thiscall
BRTS<TTA>::FindRunsMem(BRTS<TTA> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  uint uVar3;
  Run *pRVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong *puVar8;
  short sVar9;
  Run *pRVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  Run *pRVar14;
  unsigned_short uVar15;
  unsigned_short uVar16;
  long lVar17;
  long lVar18;
  short sVar19;
  Run *pRVar20;
  uint64_t *puVar21;
  long lVar22;
  long lVar23;
  Run *local_88;
  Run *local_78;
  
  lVar7 = (long)data_width;
  uVar12 = *bits_start;
  sVar19 = 0;
  local_88 = runs;
  puVar21 = bits_start;
  do {
    lVar23 = 0;
    if (uVar12 != 0) {
      for (; (uVar12 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
      }
    }
    sVar9 = (short)lVar23;
    if (uVar12 == 0) {
      do {
        puVar21 = puVar21 + 1;
        if (puVar21 == bits_start + lVar7) {
          local_88->start_pos = 0xffff;
          local_88->end_pos = 0xffff;
          if (height < 2) {
LAB_00222079:
            uVar5 = TTA::MemFlatten();
            (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar5;
            return;
          }
          uVar12 = 1;
          local_78 = runs;
LAB_00221ead:
          pRVar10 = local_88 + 1;
          puVar13 = bits_start + uVar12 * lVar7;
          puVar8 = puVar13 + lVar7;
          uVar11 = *puVar13;
          lVar23 = 0;
          local_88 = pRVar10;
          do {
            lVar17 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            lVar22 = lVar23;
            if (uVar11 == 0) {
              do {
                puVar13 = puVar13 + 1;
                if (puVar13 == puVar8) {
                  local_88->start_pos = 0xffff;
                  local_88->end_pos = 0xffff;
                  uVar12 = uVar12 + 1;
                  local_78 = pRVar10;
                  if (uVar12 != (uint)height) goto LAB_00221ead;
                  goto LAB_00222079;
                }
                lVar22 = lVar23 + 0x40;
                uVar11 = *puVar13;
                lVar17 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                  }
                }
                lVar23 = lVar22;
              } while (uVar11 == 0);
            }
            uVar11 = (~uVar11 >> ((byte)lVar17 & 0x3f)) << ((byte)lVar17 & 0x3f);
            lVar18 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
              }
            }
            lVar23 = lVar22;
            if (uVar11 == 0) {
              do {
                lVar23 = lVar23 + 0x40;
                puVar1 = puVar13 + 1;
                puVar13 = puVar13 + 1;
                uVar11 = ~*puVar1;
                lVar18 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                  }
                }
              } while (*puVar1 == 0xffffffffffffffff);
            }
            uVar16 = (unsigned_short)(lVar17 + lVar22);
            pRVar4 = local_78 + -1;
            pRVar14 = local_78;
            do {
              pRVar20 = pRVar4;
              pRVar14 = pRVar14 + 1;
              uVar2 = pRVar20[1].end_pos;
              local_78 = pRVar20 + 1;
              pRVar4 = local_78;
            } while ((uint)uVar2 < ((uint)(lVar17 + lVar22) & 0xffff));
            uVar15 = (unsigned_short)(lVar23 + lVar18);
            uVar5 = (uint)(lVar23 + lVar18) & 0xffff;
            if (uVar5 < local_78->start_pos) {
              local_88->start_pos = uVar16;
              local_88->end_pos = uVar15;
              uVar6 = TTA::MemNewLabel();
            }
            else {
              uVar6 = pRVar20[1].label;
              TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar6] =
                   TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar6] + 1;
              uVar6 = TTA::mem_rtable_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar6];
              for (; (uVar2 < uVar5 && (local_78 = pRVar14, pRVar14->start_pos <= uVar5));
                  pRVar14 = pRVar14 + 1) {
                uVar3 = pRVar14->label;
                TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar3] =
                     TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)uVar3] + 1;
                if (uVar6 != TTA::mem_rtable_.vec_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(int)uVar3]) {
                  uVar6 = TTA::MemMerge(uVar6,TTA::mem_rtable_.vec_.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start[(int)uVar3])
                  ;
                }
                uVar2 = pRVar14->end_pos;
              }
              local_88->start_pos = uVar16;
              local_88->end_pos = uVar15;
            }
            uVar11 = ~uVar11 & -1L << ((byte)lVar18 & 0x3f);
            local_88->label = uVar6;
            local_88 = local_88 + 1;
          } while( true );
        }
        sVar19 = sVar19 + 0x40;
        uVar12 = *puVar21;
        lVar23 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
          }
        }
        sVar9 = (short)lVar23;
      } while (uVar12 == 0);
    }
    uVar12 = (~uVar12 >> ((byte)sVar9 & 0x3f)) << ((byte)sVar9 & 0x3f);
    local_88->start_pos = sVar9 + sVar19;
    lVar23 = 0;
    if (uVar12 != 0) {
      for (; (uVar12 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
      }
    }
    sVar9 = (short)lVar23;
    if (uVar12 == 0) {
      do {
        sVar19 = sVar19 + 0x40;
        puVar13 = puVar21 + 1;
        puVar21 = puVar21 + 1;
        uVar12 = ~*puVar13;
        lVar23 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
          }
        }
        sVar9 = (short)lVar23;
      } while (*puVar13 == 0xffffffffffffffff);
    }
    uVar12 = (~uVar12 >> ((byte)sVar9 & 0x3f)) << ((byte)sVar9 & 0x3f);
    local_88->end_pos = sVar9 + sVar19;
    uVar5 = TTA::MemNewLabel();
    local_88->label = uVar5;
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::MemGetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::MemMerge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }